

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<MPL::ModelPackage> * __thiscall
pybind11::class_<MPL::ModelPackage>::def<bool(*)(std::__cxx11::string_const&)>
          (class_<MPL::ModelPackage> *this,char *name_,
          _func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr **f)

{
  _func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *f_00;
  _func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr **pp_Var1;
  handle local_60;
  PyObject *local_58;
  handle local_50;
  handle local_48;
  sibling local_40;
  is_method local_38;
  name local_30;
  cpp_function local_28;
  cpp_function cf;
  _func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr **f_local;
  char *name__local;
  class_<MPL::ModelPackage> *this_local;
  
  cf.super_function.super_object.super_handle.m_ptr = (function)(function)f;
  pp_Var1 = method_adaptor<MPL::ModelPackage,bool(*)(std::__cxx11::string_const&)>(f);
  f_00 = *pp_Var1;
  pybind11::name::name(&local_30,name_);
  is_method::is_method(&local_38,(handle *)this);
  local_50.m_ptr = (this->super_generic_type).super_object.super_handle.m_ptr;
  none::none((none *)&local_60);
  local_58 = local_60.m_ptr;
  getattr((pybind11 *)&local_48,local_50,name_,local_60);
  sibling::sibling(&local_40,&local_48);
  cpp_function::
  cpp_function<bool,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling>
            (&local_28,f_00,&local_30,&local_38,&local_40);
  object::~object((object *)&local_48);
  none::~none((none *)&local_60);
  detail::add_class_method((object *)this,name_,&local_28);
  cpp_function::~cpp_function(&local_28);
  return this;
}

Assistant:

class_ &def(const char *name_, Func &&f, const Extra &...extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)),
                        name(name_),
                        is_method(*this),
                        sibling(getattr(*this, name_, none())),
                        extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }